

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradeclient.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char *__s;
  size_t sVar1;
  SocketInitiator *this;
  string file;
  Application application;
  SessionSettings settings;
  FileStoreFactory storeFactory;
  ScreenLogFactory logFactory;
  long *local_300 [2];
  long local_2f0 [2];
  undefined **local_2e0;
  undefined **local_2d8;
  undefined **local_2d0;
  undefined **local_2c8;
  undefined **local_2c0;
  undefined **local_2b8;
  undefined **local_2b0;
  undefined **local_2a8;
  undefined **local_2a0;
  undefined **local_298;
  SessionSettings local_290;
  undefined1 local_200 [104];
  _Alloc_hider local_198;
  char local_188 [16];
  bool local_178;
  code *local_170;
  long *local_168;
  long local_158 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_148;
  Dictionary local_118;
  undefined *local_b8 [2];
  _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
  local_a8;
  Dictionary local_78;
  
  if (argc < 2) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"usage: ",7);
    __s = *argv;
    if (__s == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x154168);
    }
    else {
      sVar1 = strlen(__s);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,__s,sVar1);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," FILE.",6);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'h');
    std::ostream::put('h');
    std::ostream::flush();
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_300,argv[1],(allocator<char> *)&local_170);
    FIX::SessionSettings::SessionSettings(&local_290,(string *)local_300,false);
    local_2e0 = &PTR__Application_0014f2e0;
    local_2d8 = &PTR__Application_0014f398;
    local_2d0 = &PTR__Application_0014f578;
    local_2c8 = &PTR__Application_0014f768;
    local_2c0 = &PTR__Application_0014fa78;
    local_2b8 = &PTR__Application_0014fee8;
    local_2b0 = &PTR__Application_001504e8;
    local_2a8 = &PTR__Application_00150ae8;
    local_2a0 = &PTR__Application_001511a8;
    local_298 = &PTR__Application_00151b98;
    FIX::FileStoreFactory::FileStoreFactory((FileStoreFactory *)&local_170,&local_290);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)local_200,
               (_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                *)&local_290);
    local_200._48_8_ = &PTR__Dictionary_00152d40;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)(local_200 + 0x38),&local_290.m_defaults.m_data._M_t);
    local_198._M_p = local_188;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_198,local_290.m_defaults.m_name._M_dataplus._M_p,
               local_290.m_defaults.m_name._M_dataplus._M_p +
               local_290.m_defaults.m_name._M_string_length);
    local_178 = local_290.m_resolveEnvVars;
    FIX::ScreenLogFactory::ScreenLogFactory
              ((ScreenLogFactory *)local_b8,(SessionSettings *)local_200);
    FIX::Dictionary::~Dictionary((Dictionary *)(local_200 + 0x30));
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)local_200);
    this = (SocketInitiator *)operator_new(0x488);
    FIX::SocketInitiator::SocketInitiator
              (this,(Application *)&local_2e0,(MessageStoreFactory *)&local_170,&local_290,
               (LogFactory *)local_b8);
    FIX::Initiator::start();
    Application::run((Application *)&local_2e0);
    FIX::Initiator::stop(SUB81(this,0));
    (**(code **)(*(long *)this + 8))(this);
    local_b8[0] = &FIX::Message::typeinfo;
    FIX::Dictionary::~Dictionary(&local_78);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_a8);
    local_170 = __cxa_finalize;
    FIX::Dictionary::~Dictionary(&local_118);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree(&local_148);
    if (local_168 != local_158) {
      operator_delete(local_168,local_158[0] + 1);
    }
    FIX::Dictionary::~Dictionary(&local_290.m_defaults);
    std::
    _Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
    ::~_Rb_tree((_Rb_tree<FIX::SessionID,_std::pair<const_FIX::SessionID,_FIX::Dictionary>,_std::_Select1st<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>,_std::less<FIX::SessionID>,_std::allocator<std::pair<const_FIX::SessionID,_FIX::Dictionary>_>_>
                 *)&local_290);
    if (local_300[0] != local_2f0) {
      operator_delete(local_300[0],local_2f0[0] + 1);
    }
  }
  return 0;
}

Assistant:

int main(int argc, char **argv) {
  if (argc < 2) {
    std::cout << "usage: " << argv[0] << " FILE." << std::endl;
    return 0;
  }
  std::string file = argv[1];

#ifdef HAVE_SSL
  std::string isSSL;
  if (argc > 2) {
    isSSL.assign(argv[2]);
  }
#endif

  try {
    FIX::SessionSettings settings(file);

    Application application;
    FIX::FileStoreFactory storeFactory(settings);
    FIX::ScreenLogFactory logFactory(settings);

    std::unique_ptr<FIX::Initiator> initiator;
#ifdef HAVE_SSL
    if (isSSL.compare("SSL") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::ThreadedSSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else if (isSSL.compare("SSL-ST") == 0) {
      initiator = std::unique_ptr<FIX::Initiator>(
          new FIX::SSLSocketInitiator(application, storeFactory, settings, logFactory));
    } else
#endif
      initiator
          = std::unique_ptr<FIX::Initiator>(new FIX::SocketInitiator(application, storeFactory, settings, logFactory));

    initiator->start();
    application.run();
    initiator->stop();

    return 0;
  } catch (std::exception &e) {
    std::cout << e.what();
    return 1;
  }
}